

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.h
# Opt level: O0

void __thiscall
TextFile::writeFormat<std::__cxx11::string>
          (TextFile *this,char *text,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  void *__buf;
  undefined1 local_40 [8];
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  char *text_local;
  TextFile *this_local;
  
  message.field_2._8_8_ = args;
  tinyformat::format<std::__cxx11::string>
            ((string *)local_40,(tinyformat *)text,(char *)args,in_RCX);
  write(this,(int)(string *)local_40,__buf,(size_t)in_RCX);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void writeFormat(const char* text, const Args&... args)
	{
		std::string message = tfm::format(text,args...);
		write(message);
	}